

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.h
# Opt level: O0

data_type __thiscall bitmap::Bitmap::GetValPos(Bitmap *this,pos_type pos,width_type bits)

{
  ulong uVar1;
  sbyte sVar2;
  pos_type s_idx;
  pos_type s_off;
  width_type bits_local;
  pos_type pos_local;
  Bitmap *this_local;
  ulong local_8;
  
  uVar1 = pos >> 6;
  sVar2 = (sbyte)(pos & 0x3f);
  if ((pos & 0x3f) + (ulong)bits < 0x41) {
    local_8 = this->data_[uVar1] >> sVar2 & *(ulong *)(low_bits_set + (ulong)bits * 8);
  }
  else {
    local_8 = (this->data_[uVar1] >> sVar2 | this->data_[uVar1 + 1] << (0x40U - sVar2 & 0x3f)) &
              *(ulong *)(low_bits_set + (ulong)bits * 8);
  }
  return local_8;
}

Assistant:

Bitmap::data_type Bitmap::GetValPos(pos_type pos, width_type bits) const {
  pos_type s_off = pos % 64;
  pos_type s_idx = pos / 64;

  if (s_off + bits <= 64) {
    // Can be read from a single block
    return (data_[s_idx] >> s_off) & low_bits_set[bits];
  } else {
    // Must be read from two blocks
    return ((data_[s_idx] >> s_off) | (data_[s_idx + 1] << (64 - s_off)))
        & low_bits_set[bits];
  }
}